

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

BinOpr subexpr(LexState *ls,expdesc *v,int limit)

{
  l_uint32 *plVar1;
  int iVar2;
  BinOpr BVar3;
  anon_union_8_6_45a55102_for_u aVar4;
  BinOpr op;
  UnOpr opr;
  expdesc v2;
  expdesc local_48;
  
  luaE_incCstack(ls->L);
  iVar2 = (ls->t).token;
  if (0x112 < iVar2) {
    if (iVar2 < 0x121) {
      if (iVar2 == 0x113) {
        v->t = -1;
        v->f = -1;
        v->k = VTRUE;
        goto LAB_0014a8a9;
      }
      if (iVar2 != 0x118) goto switchD_0014a758_caseD_107;
      if (ls->fs->f->is_vararg == '\0') {
        luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
      }
      iVar2 = luaK_codeABCk(ls->fs,OP_VARARG,0,0,1,0);
      v->t = -1;
      v->f = -1;
      v->k = VVARARG;
      (v->u).info = iVar2;
    }
    else if (iVar2 == 0x121) {
      v->t = -1;
      v->f = -1;
      v->k = VKFLT;
      (v->u).info = 0;
      v->u = *(anon_union_8_6_45a55102_for_u *)&(ls->t).seminfo;
    }
    else {
      if (iVar2 == 0x122) {
        v->t = -1;
        v->f = -1;
        v->k = VKINT;
        (v->u).info = 0;
        aVar4 = *(anon_union_8_6_45a55102_for_u *)&(ls->t).seminfo;
      }
      else {
        if (iVar2 != 0x124) goto switchD_0014a758_caseD_107;
        aVar4 = *(anon_union_8_6_45a55102_for_u *)&(ls->t).seminfo;
        v->t = -1;
        v->f = -1;
        v->k = VKSTR;
      }
      v->u = aVar4;
    }
    goto LAB_0014a8b0;
  }
  if (iVar2 < 0x7e) {
    if (iVar2 == 0x23) {
      opr = OPR_LEN;
    }
    else {
      if (iVar2 != 0x2d) {
        if (iVar2 != 0x7b) goto switchD_0014a758_caseD_107;
        constructor(ls,v);
        goto LAB_0014a8b8;
      }
      opr = OPR_MINUS;
    }
LAB_0014a861:
    iVar2 = ls->linenumber;
    luaX_next(ls);
    subexpr(ls,v,0xc);
    luaK_prefix(ls->fs,opr,v,iVar2);
    goto LAB_0014a8b8;
  }
  switch(iVar2) {
  case 0x106:
    v->t = -1;
    v->f = -1;
    v->k = VFALSE;
    break;
  case 0x107:
  case 0x109:
  case 0x10a:
  case 0x10b:
  case 0x10c:
    goto switchD_0014a758_caseD_107;
  case 0x108:
    luaX_next(ls);
    body(ls,v,0,ls->linenumber);
    goto LAB_0014a8b8;
  case 0x10d:
    v->t = -1;
    v->f = -1;
    v->k = VNIL;
    break;
  case 0x10e:
    opr = OPR_NOT;
    goto LAB_0014a861;
  default:
    if (iVar2 == 0x7e) {
      opr = OPR_BNOT;
      goto LAB_0014a861;
    }
    goto switchD_0014a758_caseD_107;
  }
LAB_0014a8a9:
  (v->u).info = 0;
LAB_0014a8b0:
  luaX_next(ls);
LAB_0014a8b8:
  iVar2 = (ls->t).token;
  op = OPR_NOBINOPR;
  if (iVar2 < 0x7e) {
    if (iVar2 < 0x3c) {
      switch(iVar2) {
      case 0x25:
        op = OPR_MOD;
        break;
      case 0x26:
        op = OPR_BAND;
        break;
      default:
        goto switchD_0014a8e9_caseD_27;
      case 0x2a:
        op = OPR_MUL;
        break;
      case 0x2b:
        op = OPR_ADD;
        break;
      case 0x2d:
        op = OPR_SUB;
        break;
      case 0x2f:
        op = OPR_DIV;
      }
    }
    else if (iVar2 < 0x5e) {
      if (iVar2 == 0x3c) {
        op = OPR_LT;
      }
      else {
        if (iVar2 != 0x3e) goto switchD_0014a8e9_caseD_27;
        op = OPR_GT;
      }
    }
    else if (iVar2 == 0x5e) {
      op = OPR_POW;
    }
    else {
      if (iVar2 != 0x7c) goto switchD_0014a8e9_caseD_27;
      op = OPR_BOR;
    }
  }
  else {
    switch(iVar2) {
    case 0x10f:
      op = OPR_OR;
      break;
    case 0x110:
    case 0x111:
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x118:
      goto switchD_0014a8e9_caseD_27;
    case 0x116:
      op = OPR_IDIV;
      break;
    case 0x117:
      op = OPR_CONCAT;
      break;
    case 0x119:
      op = OPR_EQ;
      break;
    case 0x11a:
      op = OPR_GE;
      break;
    case 0x11b:
      op = OPR_LE;
      break;
    case 0x11c:
      op = OPR_NE;
      break;
    case 0x11d:
      op = OPR_SHL;
      break;
    case 0x11e:
      op = OPR_SHR;
      break;
    default:
      if (iVar2 == 0x7e) {
        op = OPR_BXOR;
      }
      else {
        if (iVar2 != 0x100) goto switchD_0014a8e9_caseD_27;
        op = OPR_AND;
      }
    }
  }
  do {
    if ((int)(uint)priority[op].left <= limit) goto switchD_0014a8e9_caseD_27;
    iVar2 = ls->linenumber;
    luaX_next(ls);
    luaK_infix(ls->fs,op,v);
    BVar3 = subexpr(ls,&local_48,(uint)priority[op].right);
    luaK_posfix(ls->fs,op,v,&local_48,iVar2);
    op = BVar3;
  } while (BVar3 != OPR_NOBINOPR);
  op = OPR_NOBINOPR;
switchD_0014a8e9_caseD_27:
  plVar1 = &ls->L->nCcalls;
  *plVar1 = *plVar1 - 1;
  return op;
switchD_0014a758_caseD_107:
  suffixedexp(ls,v);
  goto LAB_0014a8b8;
}

Assistant:

static BinOpr subexpr (LexState *ls, expdesc *v, int limit) {
  BinOpr op;
  UnOpr uop;
  enterlevel(ls);
  uop = getunopr(ls->t.token);
  if (uop != OPR_NOUNOPR) {  /* prefix (unary) operator? */
    int line = ls->linenumber;
    luaX_next(ls);  /* skip operator */
    subexpr(ls, v, UNARY_PRIORITY);
    luaK_prefix(ls->fs, uop, v, line);
  }
  else simpleexp(ls, v);
  /* expand while operators have priorities higher than 'limit' */
  op = getbinopr(ls->t.token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    expdesc v2;
    BinOpr nextop;
    int line = ls->linenumber;
    luaX_next(ls);  /* skip operator */
    luaK_infix(ls->fs, op, v);
    /* read sub-expression with higher priority */
    nextop = subexpr(ls, &v2, priority[op].right);
    luaK_posfix(ls->fs, op, v, &v2, line);
    op = nextop;
  }
  leavelevel(ls);
  return op;  /* return first untreated operator */
}